

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O0

NodeFS * __thiscall NodeFS::InsertNode(NodeFS *this,string *node_name)

{
  bool bVar1;
  __type _Var2;
  reference ppNVar3;
  NodeFS *this_00;
  NodeFS *local_38;
  NodeFS *new_node;
  __normal_iterator<NodeFS_**,_std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>_> local_28;
  iterator it;
  string *node_name_local;
  NodeFS *this_local;
  
  it._M_current = (NodeFS **)node_name;
  local_28._M_current =
       (NodeFS **)std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>::begin(&this->sub_node_);
  while( true ) {
    new_node = (NodeFS *)std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>::end(&this->sub_node_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<NodeFS_**,_std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>_>
                        *)&new_node);
    if (!bVar1) {
      this_00 = (NodeFS *)operator_new(0x68);
      NodeFS(this_00);
      local_38 = this_00;
      std::__cxx11::string::operator=((string *)&this_00->name_,(string *)node_name);
      local_38->is_leaf_ = false;
      std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>::push_back(&this->sub_node_,&local_38);
      return local_38;
    }
    ppNVar3 = __gnu_cxx::
              __normal_iterator<NodeFS_**,_std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>_>::
              operator*(&local_28);
    _Var2 = std::operator==(&(*ppNVar3)->name_,node_name);
    if (_Var2) break;
    __gnu_cxx::__normal_iterator<NodeFS_**,_std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>_>::
    operator++(&local_28);
  }
  ppNVar3 = __gnu_cxx::
            __normal_iterator<NodeFS_**,_std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>_>::
            operator*(&local_28);
  return *ppNVar3;
}

Assistant:

NodeFS* NodeFS::InsertNode(std::string node_name)
{
   // Look for node : Already exists ?
   for (std::vector<NodeFS*>::iterator it = sub_node_.begin(); it != sub_node_.end(); ++it)
   {
      if ((*it)->name_ == node_name)
         return *it;
   }
   // It does not exists
   NodeFS* new_node = new NodeFS;
   new_node->name_ = node_name;
   new_node->is_leaf_ = false;
   sub_node_.push_back(new_node);

   return new_node;
}